

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  char *pcVar1;
  char cVar2;
  uint *__n;
  size_t sVar3;
  void *__buf;
  size_t sVar4;
  long lVar5;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  char *pcVar6;
  char *pcVar7;
  char_t *pcVar8;
  char_t *pcVar9;
  ulong uVar10;
  
  __n = &switchD_00129b67::switchdataD_001307e0;
  switch((uint)node->header & 0xf) {
  case 3:
    pcVar6 = "";
    if (node->value != (char_t *)0x0) {
      pcVar6 = node->value;
    }
    text_output(writer,pcVar6,ctx_special_pcdata,flags);
    return;
  case 4:
    pcVar6 = "";
    if (node->value != (char_t *)0x0) {
      pcVar6 = node->value;
    }
    break;
  case 5:
    pcVar6 = "";
    if (node->value != (char *)0x0) {
      pcVar6 = node->value;
    }
    sVar3 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
LAB_00129c19:
    cVar2 = *pcVar6;
    if (cVar2 == '\0') {
      xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
      return;
    }
    sVar4 = 0;
    pcVar1 = pcVar6;
    do {
      pcVar7 = pcVar1 + 1;
      if (cVar2 == '-') {
        cVar2 = *pcVar7;
        if ((cVar2 == '\0') || (cVar2 == '-')) goto LAB_00129c4d;
      }
      else {
        if (cVar2 == '\0') goto LAB_00129c4d;
        cVar2 = *pcVar7;
      }
      sVar4 = sVar4 + 1;
      pcVar1 = pcVar7;
    } while( true );
  case 6:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x1307e0);
    pcVar6 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar6 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar6);
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf,(size_t)__n);
      pcVar9 = node->value;
LAB_00129cdd:
      cVar2 = *pcVar9;
      if (cVar2 != '\0') {
        sVar4 = 0;
        pcVar8 = pcVar9;
        do {
          if (cVar2 == '?') {
            cVar2 = pcVar8[1];
            if (cVar2 == '>') goto LAB_00129d0b;
          }
          else {
            if (cVar2 == '\0') goto LAB_00129d0b;
            cVar2 = pcVar8[1];
          }
          pcVar8 = pcVar8 + 1;
          sVar4 = sVar4 + 1;
        } while( true );
      }
    }
    goto LAB_00129d3f;
  case 7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x1307e0);
    pcVar6 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar6 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar6);
    __n = (uint *)0x0;
    node_output_attributes(writer,node,"",0,flags | 4,0);
LAB_00129d3f:
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)__n);
    return;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    sVar3 = 0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    __buf_01 = __buf_00;
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf_00,sVar3);
      xml_buffered_writer::write_string(writer,node->value);
      __buf_01 = extraout_RDX;
    }
    xml_buffered_writer::write(writer,0x3e,__buf_01,sVar3);
    return;
  default:
    return;
  }
LAB_00129d68:
  xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x5b);
  xml_buffered_writer::write(writer,0x41,(void *)0x54,0x41);
  lVar5 = 0;
  pcVar9 = pcVar6;
  do {
    cVar2 = *pcVar9;
    if (cVar2 == ']') {
      if ((pcVar9[1] == ']') && (pcVar9[2] == '>')) goto LAB_00129dbe;
    }
    else if (cVar2 == '\0') goto LAB_00129dbe;
    pcVar9 = pcVar9 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
LAB_00129d0b:
  xml_buffered_writer::write_buffer(writer,pcVar9,sVar4);
  pcVar9 = pcVar8;
  if (*pcVar8 != '\0') {
    __n = (uint *)0x3e;
    xml_buffered_writer::write(writer,0x3f,(void *)0x20,0x3e);
    pcVar9 = pcVar8 + 2;
  }
  goto LAB_00129cdd;
LAB_00129c4d:
  xml_buffered_writer::write_buffer(writer,pcVar6,sVar4);
  pcVar6 = pcVar1;
  if (*pcVar1 != '\0') {
    xml_buffered_writer::write(writer,0x2d,(void *)0x20,sVar3);
    pcVar6 = pcVar7;
  }
  goto LAB_00129c19;
LAB_00129dbe:
  uVar10 = (ulong)((uint)(cVar2 != '\0') * 2);
  xml_buffered_writer::write_buffer(writer,pcVar6,lVar5 + uVar10);
  xml_buffered_writer::write(writer,0x5d,(void *)0x5d,0x3e);
  pcVar6 = pcVar9 + uVar10;
  if (pcVar9[uVar10] == '\0') {
    return;
  }
  goto LAB_00129d68;
}

Assistant:

PUGI_IMPL_FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI_IMPL_NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}